

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

void Mpm_ObjAddChoiceCutsToStore(Mpm_Man_t *p,Mig_Obj_t *pRoot,Mig_Obj_t *pObj,int ReqTime)

{
  Mig_Fan_t MVar1;
  Mig_Fan_t MVar2;
  Mmr_Step_t *pMVar3;
  long lVar4;
  uint uVar5;
  Mpm_Cut_t *pMVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  
  MVar1 = pObj->pFans[3];
  uVar5 = (uint)MVar1 >> 1;
  if ((p->vCutLists).nSize <= (int)uVar5) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar5 = (p->vCutLists).pArray[uVar5];
  if (uVar5 != 0) {
    MVar2 = pRoot->pFans[3];
    do {
      pMVar3 = p->pManCuts;
      uVar8 = pMVar3->uMask & uVar5;
      if ((int)uVar8 < 1) {
        __assert_fail("(h & p->uMask) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mem/mem2.h"
                      ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
      }
      uVar5 = (int)uVar5 >> ((byte)pMVar3->nBits & 0x1f);
      if ((int)uVar5 < 1) {
LAB_0040790a:
        __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/mem/mem2.h"
                      ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
      }
      iVar9 = *(int *)((long)pMVar3 + (ulong)uVar8 * 0x38 + 0x34);
      bVar7 = (byte)*(undefined4 *)((long)pMVar3 + (ulong)uVar8 * 0x38 + 0x18);
      if (iVar9 << (bVar7 & 0x1f) <= (int)uVar5) goto LAB_0040790a;
      uVar10 = uVar5 >> (bVar7 & 0x1f);
      if (iVar9 <= (int)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar4 = *(long *)(*(long *)((long)pMVar3 + (ulong)uVar8 * 0x38 + 0x38) + (ulong)uVar10 * 8);
      uVar11 = (ulong)(uVar5 & *(uint *)((long)pMVar3 + (ulong)uVar8 * 0x38 + 0x1c));
      uVar10 = *(uint *)(lVar4 + 4 + uVar11 * 8);
      if ((uVar10 >> 0x19) + 0xc >> 3 != uVar8) {
        __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmInt.h"
                      ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
      }
      pMVar6 = (Mpm_Cut_t *)(lVar4 + uVar11 * 8);
      if (pMVar6->pLeaves[0] < 0) {
LAB_004078eb:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar5 = pMVar6->hNext;
      if (1 < (pMVar6->pLeaves[0] ^ (uint)pObj->pFans[3])) {
        iVar9 = 0;
        if (0x7ffffff < uVar10) {
          uVar11 = 0;
          iVar9 = 0;
          do {
            if (pMVar6->pLeaves[uVar11] < 0) goto LAB_004078eb;
            iVar12 = p->pLibLut->pLutDelays[uVar10 >> 0x1b][uVar11] +
                     (p->vTimes).pArray[(uint)pMVar6->pLeaves[uVar11] >> 1];
            if (iVar9 <= iVar12) {
              iVar9 = iVar12;
            }
            uVar11 = uVar11 + 1;
          } while (uVar10 >> 0x1b != uVar11);
        }
        if (iVar9 <= ReqTime) {
          *(uint *)&pMVar6->field_0x4 = uVar10 ^ (((uint)MVar1 ^ (uint)MVar2) & 1) << 0x19;
          pMVar6 = Mpm_ManMergeCuts(p,pMVar6,(Mpm_Cut_t *)0x0,(Mpm_Cut_t *)0x0);
          Mpm_ObjAddCutToStore(p,pMVar6,iVar9);
        }
      }
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void Mpm_ObjAddChoiceCutsToStore( Mpm_Man_t * p, Mig_Obj_t * pRoot, Mig_Obj_t * pObj, int ReqTime )
{
    Mpm_Cut_t * pCut;
    int hCut, hNext, ArrTime;
    int fCompl = Mig_ObjPhase(pRoot) ^ Mig_ObjPhase(pObj);
    Mpm_ObjForEachCutSafe( p, pObj, hCut, pCut, hNext )
    {
        if ( Abc_Lit2Var(pCut->pLeaves[0]) == Mig_ObjId(pObj) )
            continue;
        ArrTime = Mpm_CutGetArrTime( p, pCut );
        if ( ArrTime > ReqTime )
            continue;
        pCut->fCompl ^= fCompl;
        pCut = Mpm_ManMergeCuts( p, pCut, NULL, NULL );
        Mpm_ObjAddCutToStore( p, pCut, ArrTime );
    }
}